

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharItem.cpp
# Opt level: O0

string * __thiscall
Hpipe::CharItem::compact_repr_abi_cxx11_(string *__return_storage_ptr__,CharItem *this)

{
  int iVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  CharItem *local_38;
  mapped_type local_30;
  undefined1 local_29;
  uint c;
  CharItem *local_20;
  CharItem *local_18;
  CharItem *this_local;
  string *res;
  
  local_18 = this;
  this_local = (CharItem *)__return_storage_ptr__;
  if ((compact_repr[abi:cxx11]()::d == '\0') &&
     (iVar1 = __cxa_guard_acquire(&compact_repr[abi:cxx11]()::d), iVar1 != 0)) {
    std::
    unordered_map<const_Hpipe::CharItem_*,_unsigned_int,_std::hash<const_Hpipe::CharItem_*>,_std::equal_to<const_Hpipe::CharItem_*>,_std::allocator<std::pair<const_Hpipe::CharItem_*const,_unsigned_int>_>_>
    ::unordered_map(&compact_repr::d);
    __cxa_atexit(std::
                 unordered_map<const_Hpipe::CharItem_*,_unsigned_int,_std::hash<const_Hpipe::CharItem_*>,_std::equal_to<const_Hpipe::CharItem_*>,_std::allocator<std::pair<const_Hpipe::CharItem_*const,_unsigned_int>_>_>
                 ::~unordered_map,&compact_repr::d,&__dso_handle);
    __cxa_guard_release(&compact_repr[abi:cxx11]()::d);
  }
  local_20 = this;
  sVar2 = std::
          unordered_map<const_Hpipe::CharItem_*,_unsigned_int,_std::hash<const_Hpipe::CharItem_*>,_std::equal_to<const_Hpipe::CharItem_*>,_std::allocator<std::pair<const_Hpipe::CharItem_*const,_unsigned_int>_>_>
          ::count(&compact_repr::d,&local_20);
  if (sVar2 == 0) {
    sVar2 = std::
            unordered_map<const_Hpipe::CharItem_*,_unsigned_int,_std::hash<const_Hpipe::CharItem_*>,_std::equal_to<const_Hpipe::CharItem_*>,_std::allocator<std::pair<const_Hpipe::CharItem_*const,_unsigned_int>_>_>
            ::size(&compact_repr::d);
    _c = this;
    pmVar3 = std::
             unordered_map<const_Hpipe::CharItem_*,_unsigned_int,_std::hash<const_Hpipe::CharItem_*>,_std::equal_to<const_Hpipe::CharItem_*>,_std::allocator<std::pair<const_Hpipe::CharItem_*const,_unsigned_int>_>_>
             ::operator[](&compact_repr::d,(key_type *)&c);
    *pmVar3 = (mapped_type)sVar2;
  }
  local_29 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_38 = this;
  pmVar3 = std::
           unordered_map<const_Hpipe::CharItem_*,_unsigned_int,_std::hash<const_Hpipe::CharItem_*>,_std::equal_to<const_Hpipe::CharItem_*>,_std::allocator<std::pair<const_Hpipe::CharItem_*const,_unsigned_int>_>_>
           ::operator[](&compact_repr::d,&local_38);
  local_30 = *pmVar3;
  if (local_30 == 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,'0');
  }
  else {
    for (; local_30 != 0; local_30 = local_30 / 0x1a) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,
                 (char)local_30 + (char)(local_30 / 0x1a) * -0x1a + 'a');
    }
    __first._M_current = (char *)std::__cxx11::string::begin();
    __last._M_current = (char *)std::__cxx11::string::end();
    std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(__first,__last);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CharItem::compact_repr() const {
    static std::unordered_map<const CharItem *,unsigned> d;
    if ( not d.count( this ) )
        d[ this ] = d.size();
    std::string res;
    unsigned c = d[ this ];
    if ( not c )
        res = '0';
    else {
        while ( c ) {
            res += 'a' + c % 26;
            c /= 26;
        }
        std::reverse( res.begin(), res.end() );
    }
    return res;
}